

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O3

void __thiscall
HACD::WuColorQuantizer::Quantize
          (WuColorQuantizer *this,HaI32 PaletteSize,Vec3Vector *outputVertices)

{
  Vec3 *pVVar1;
  undefined8 uVar2;
  Vec3 *pVVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  HaI32 HVar8;
  uint uVar9;
  HaU8 *tag;
  HaU32 capacity;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  WuColorQuantizer *this_00;
  Box *cube;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  HaF32 HVar17;
  HaF32 HVar18;
  float fVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  HaF32 vv [1024];
  uint local_8038;
  HaF32 local_8034 [1023];
  Box local_7038 [1024];
  
  uVar9 = 0x400;
  if (PaletteSize < 0x400) {
    uVar9 = PaletteSize;
  }
  M3D(this,this->mWeight,this->mSumX,this->mSumY,this->mSumZ,this->mSumSquared);
  local_7038[0]._8_8_ = 0x2000000000;
  local_7038[0]._0_8_ = 0x2000000000;
  local_7038[0].b0 = 0;
  local_7038[0].b1 = 0x20;
  uVar12 = uVar9;
  if (1 < PaletteSize) {
    uVar14 = 1;
    iVar7 = 0;
    do {
      lVar13 = (long)iVar7;
      bVar6 = Cut(this,local_7038 + lVar13,local_7038 + (int)uVar14);
      if (bVar6) {
        HVar17 = 0.0;
        if (1 < local_7038[lVar13].vol) {
          HVar17 = Var(this,local_7038 + lVar13);
        }
        HVar18 = 0.0;
        iVar7 = local_7038[(int)uVar14].vol;
        local_8034[lVar13 + -1] = HVar17;
        if (1 < iVar7) {
          HVar18 = Var(this,local_7038 + (int)uVar14);
        }
        local_8034[(long)(int)uVar14 + -1] = HVar18;
      }
      else {
        uVar14 = uVar14 - 1;
        local_8034[lVar13 + -1] = 0.0;
      }
      auVar20 = ZEXT464(local_8038);
      if ((int)uVar14 < 1) {
        iVar7 = 0;
      }
      else {
        uVar11 = 1;
        iVar7 = 0;
        do {
          fVar19 = auVar20._0_4_;
          auVar15 = vmaxss_avx(ZEXT416((uint)local_8034[uVar11 - 1]),auVar20._0_16_);
          auVar20 = ZEXT1664(auVar15);
          if (fVar19 < (float)local_8034[uVar11 - 1]) {
            iVar7 = (int)uVar11;
          }
          uVar11 = uVar11 + 1;
        } while (uVar14 + 1 != uVar11);
      }
      uVar14 = uVar14 + 1;
      uVar12 = uVar14;
    } while ((0.0 < auVar20._0_4_) && (uVar12 = uVar9, (int)uVar14 < (int)uVar9));
  }
  free(this->mSumSquared);
  this_00 = (WuColorQuantizer *)0x1;
  this->mSumSquared = (HaF32 *)0x0;
  tag = (HaU8 *)calloc(1,0x8c61);
  if (0 < (int)uVar12) {
    cube = local_7038;
    uVar11 = 0;
    do {
      Mark(this_00,cube,(HaI32)uVar11,tag);
      HVar8 = Vol(this_00,cube,this->mWeight);
      if (HVar8 != 0) {
        uVar9 = Vol(this_00,cube,this->mSumX);
        fVar19 = (float)HVar8;
        HVar8 = Vol(this_00,cube,this->mSumY);
        auVar21._4_4_ = fVar19;
        auVar21._0_4_ = fVar19;
        auVar21._8_4_ = fVar19;
        auVar21._12_4_ = fVar19;
        auVar15 = vpinsrd_avx(ZEXT416(uVar9),HVar8,1);
        auVar15 = vcvtdq2ps_avx(auVar15);
        auVar15 = vdivps_avx(auVar15,auVar21);
        auVar16._8_4_ = 0x3f000000;
        auVar16._0_8_ = 0x3f0000003f000000;
        auVar16._12_4_ = 0x3f000000;
        auVar15 = vaddps_avx512vl(auVar15,auVar16);
        HVar8 = Vol(this_00,cube,this->mSumZ);
        if (0xff < (uint)(int)auVar15._0_4_) {
          __assert_fail("red >= 0 && red < 256",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x250,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
        }
        auVar5._4_4_ = (int)auVar15._4_4_;
        auVar5._0_4_ = (int)auVar15._0_4_;
        auVar5._8_4_ = (int)auVar15._8_4_;
        auVar5._12_4_ = (int)auVar15._12_4_;
        uVar9 = vextractps_avx(auVar5,1);
        if (0xff < uVar9) {
          __assert_fail("green >= 0 && green < 256",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x251,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
        }
        uVar9 = (uint)((float)HVar8 / fVar19 + 0.5);
        if (0xff < uVar9) {
          __assert_fail("blue >= 0 && blue < 256",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x252,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
        }
        auVar16 = vcvtudq2ps_avx512vl(auVar5);
        auVar15._8_4_ = 0xc3000000;
        auVar15._0_8_ = 0xc3000000c3000000;
        auVar15._12_4_ = 0xc3000000;
        auVar15 = vaddps_avx512vl(auVar16,auVar15);
        auVar4._8_4_ = 0x3c000000;
        auVar4._0_8_ = 0x3c0000003c000000;
        auVar4._12_4_ = 0x3c000000;
        auVar15 = vmulps_avx512vl(auVar15,auVar4);
        uVar10 = outputVertices->mCapacity & 0x7fffffff;
        uVar14 = outputVertices->mSize;
        if (uVar10 <= uVar14) {
          uVar14 = uVar10 * 2;
          if (uVar10 == 0) {
            uVar14 = 1;
          }
          if (uVar14 <= uVar10) {
            __assert_fail("this->capacity() < capacity",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                          ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
          }
          this_00 = (WuColorQuantizer *)outputVertices;
          hacd::vector<HACD::Vec3>::recreate(outputVertices,uVar14);
          uVar14 = outputVertices->mSize;
        }
        pVVar3 = outputVertices->mData;
        pVVar1 = pVVar3 + uVar14;
        uVar2 = vmovlps_avx(auVar15);
        pVVar1->x = (HaF32)(int)uVar2;
        pVVar1->y = (HaF32)(int)((ulong)uVar2 >> 0x20);
        pVVar3[uVar14].z = (HaF32)(((float)(int)uVar9 + -128.0) * 0.0078125);
        outputVertices->mSize = uVar14 + 1;
      }
      uVar11 = uVar11 + 1;
      cube = cube + 1;
    } while (uVar12 != uVar11);
  }
  return;
}

Assistant:

void WuColorQuantizer::Quantize(HaI32 PaletteSize,Vec3Vector &outputVertices) 
{
	HaU8 *tag = NULL;

	if ( PaletteSize > MAXCOLOR )
	{
		PaletteSize = MAXCOLOR;
	}
	Box	cube[MAXCOLOR];
	HaI32	next;
	HaI32 i, weight;
	HaI32 k;
	HaF32 vv[MAXCOLOR], temp;

	// Compute moments
	M3D(mWeight, mSumX, mSumY, mSumZ, mSumSquared);

	cube[0].r0 = cube[0].g0 = cube[0].b0 = 0;
	cube[0].r1 = cube[0].g1 = cube[0].b1 = 32;
	next = 0;

	for (i = 1; i < PaletteSize; i++) 
	{
		if(Cut(&cube[next], &cube[i])) 
		{
			// volume test ensures we won't try to cut one-cell box
			vv[next] = (cube[next].vol > 1) ? Var(&cube[next]) : 0;
			vv[i] = (cube[i].vol > 1) ? Var(&cube[i]) : 0;
		} 
		else 
		{
			vv[next] = 0.0;   // don't try to split this box again
			i--;              // didn't create box i
		}

		next = 0; temp = vv[0];

		for (k = 1; k <= i; k++) 
		{
			if (vv[k] > temp) 
			{
				temp = vv[k]; next = k;
			}
		}

		if (temp <= 0.0) 
		{
			PaletteSize = i + 1;
			// Error: "Only got 'PaletteSize' boxes"
			break;
		}
	}

	// Partition done
	// the space for array mSumSquared can be freed now
	free(mSumSquared);
	mSumSquared = NULL;

	// create an optimized palette
	tag = (HaU8*) malloc(SIZE_3D * sizeof(HaU8));
	memset(tag, 0, SIZE_3D * sizeof(HaU8));

	for (k = 0; k < PaletteSize ; k++) 
	{
		Mark(&cube[k], k, tag);
		weight = Vol(&cube[k], mWeight);

		if (weight) 
		{
			HaI32 red	= (HaI32)(((HaF32)Vol(&cube[k], mSumX) / (HaF32)weight) + 0.5f);
			HaI32 green = (HaI32)(((HaF32)Vol(&cube[k], mSumY) / (HaF32)weight) + 0.5f);
			HaI32 blue	= (HaI32)(((HaF32)Vol(&cube[k], mSumZ) / (HaF32)weight) + 0.5f);
			HACD_ASSERT( red >= 0 && red < 256 );
			HACD_ASSERT( green >= 0 && green < 256 );
			HACD_ASSERT( blue >= 0 && blue < 256 );
			Vec3 v;
			v.x = (red-128.0f)/128.0f;
			v.y = (green-128.0f)/128.0f;
			v.z = (blue-128.0f)/128.0f;
			outputVertices.push_back(v);
		} 
		else 
		{
		}
	}
}